

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  size_t this_00;
  bool bVar1;
  LogMessage *other;
  size_type sVar2;
  const_reference ppFVar3;
  OneofDescriptor *this_01;
  string *psVar4;
  reference ppFVar5;
  FieldGenerator *pFVar6;
  string local_f0;
  FieldDescriptor *local_d0;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  OneofDescriptor *oneof;
  LogFinisher local_9e;
  byte local_9d;
  LogMessage local_90;
  undefined1 local_58 [8];
  Formatter format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)fields;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  bVar1 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_9d = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xed0);
    local_9d = 1;
    other = internal::LogMessage::operator<<(&local_90,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=(&local_9e,other);
  }
  if ((local_9d & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_90);
  }
  sVar2 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar2 == 1) {
    ppFVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    GenerateSerializeOneField(this,printer,*ppFVar3,-1);
  }
  else {
    ppFVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    this_01 = FieldDescriptor::containing_oneof(*ppFVar3);
    psVar4 = OneofDescriptor::name_abi_cxx11_(this_01);
    Formatter::operator()((Formatter *)local_58,"switch ($1$_case()) {\n",psVar4);
    Formatter::Indent((Formatter *)local_58);
    this_00 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar1) {
      ppFVar5 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      local_d0 = *ppFVar5;
      psVar4 = FieldDescriptor::name_abi_cxx11_(local_d0);
      UnderscoresToCamelCase(&local_f0,psVar4,true);
      Formatter::operator()((Formatter *)local_58,"case k$1$: {\n",&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      Formatter::Indent((Formatter *)local_58);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,local_d0);
      (*pFVar6->_vptr_FieldGenerator[0x13])(pFVar6,printer);
      Formatter::operator()<>((Formatter *)local_58,"break;\n");
      Formatter::Outdent((Formatter *)local_58);
      Formatter::operator()<>((Formatter *)local_58,"}\n");
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    Formatter::Outdent((Formatter *)local_58);
    Formatter::operator()<>((Formatter *)local_58,"  default: ;\n}\n");
  }
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* printer, const std::vector<const FieldDescriptor*>& fields) {
  Formatter format(printer, variables_);
  GOOGLE_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(printer, fields[0], -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  format("switch ($1$_case()) {\n", oneof->name());
  format.Indent();
  for (auto field : fields) {
    format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
    format.Indent();
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
    format("break;\n");
    format.Outdent();
    format("}\n");
  }
  format.Outdent();
  // Doing nothing is an option.
  format(
      "  default: ;\n"
      "}\n");
}